

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_mem.hpp
# Opt level: O1

void duckdb::FastMemcpy(void *dest,void *src,size_t size)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  switch(size) {
  case 0:
    goto switchD_015ff80e_caseD_0;
  case 1:
    *(undefined1 *)dest = *src;
switchD_015ff80e_caseD_0:
    return;
  case 2:
    goto switchD_015ff80e_caseD_2;
  case 3:
    *(undefined1 *)((long)dest + 2) = *(undefined1 *)((long)src + 2);
switchD_015ff80e_caseD_2:
    *(undefined2 *)dest = *src;
    return;
  case 4:
    goto switchD_015ff80e_caseD_4;
  case 5:
    *(undefined1 *)((long)dest + 4) = *(undefined1 *)((long)src + 4);
    goto switchD_015ff80e_caseD_4;
  case 6:
    *(undefined2 *)((long)dest + 4) = *(undefined2 *)((long)src + 4);
switchD_015ff80e_caseD_4:
    uVar2 = *src;
LAB_015ff8fd:
    *(undefined4 *)dest = uVar2;
    return;
  case 7:
    uVar2 = *src;
    *(undefined4 *)((long)dest + 3) = *(undefined4 *)((long)src + 3);
    goto LAB_015ff8fd;
  case 8:
    goto switchD_015ff80e_caseD_8;
  case 9:
    *(undefined1 *)((long)dest + 8) = *(undefined1 *)((long)src + 8);
    goto switchD_015ff80e_caseD_8;
  case 10:
    *(undefined2 *)((long)dest + 8) = *(undefined2 *)((long)src + 8);
    goto switchD_015ff80e_caseD_8;
  case 0xb:
    *(undefined4 *)((long)dest + 7) = *(undefined4 *)((long)src + 7);
    goto switchD_015ff80e_caseD_8;
  case 0xc:
    *(undefined4 *)((long)dest + 8) = *(undefined4 *)((long)src + 8);
switchD_015ff80e_caseD_8:
    uVar1 = *src;
LAB_016002d3:
    *(undefined8 *)dest = uVar1;
    return;
  case 0xd:
    uVar1 = *src;
    *(undefined8 *)((long)dest + 5) = *(undefined8 *)((long)src + 5);
    goto LAB_016002d3;
  case 0xe:
    uVar1 = *src;
    *(undefined8 *)((long)dest + 6) = *(undefined8 *)((long)src + 6);
    goto LAB_016002d3;
  case 0xf:
    uVar1 = *src;
    *(undefined8 *)((long)dest + 7) = *(undefined8 *)((long)src + 7);
    goto LAB_016002d3;
  case 0x10:
    break;
  case 0x11:
    *(undefined1 *)((long)dest + 0x10) = *(undefined1 *)((long)src + 0x10);
    break;
  case 0x12:
    *(undefined2 *)((long)dest + 0x10) = *(undefined2 *)((long)src + 0x10);
    break;
  case 0x13:
    *(undefined4 *)((long)dest + 0xf) = *(undefined4 *)((long)src + 0xf);
    break;
  case 0x14:
    *(undefined4 *)((long)dest + 0x10) = *(undefined4 *)((long)src + 0x10);
    break;
  case 0x15:
    *(undefined8 *)((long)dest + 0xd) = *(undefined8 *)((long)src + 0xd);
    break;
  case 0x16:
    *(undefined8 *)((long)dest + 0xe) = *(undefined8 *)((long)src + 0xe);
    break;
  case 0x17:
    *(undefined8 *)((long)dest + 0xf) = *(undefined8 *)((long)src + 0xf);
    break;
  case 0x18:
    *(undefined8 *)((long)dest + 0x10) = *(undefined8 *)((long)src + 0x10);
    break;
  case 0x19:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x11);
    *(undefined8 *)((long)dest + 9) = *(undefined8 *)((long)src + 9);
    *(undefined8 *)((long)dest + 0x11) = uVar1;
    goto LAB_016002ed;
  case 0x1a:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x12);
    *(undefined8 *)((long)dest + 10) = *(undefined8 *)((long)src + 10);
    *(undefined8 *)((long)dest + 0x12) = uVar1;
    goto LAB_016002ed;
  case 0x1b:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x13);
    *(undefined8 *)((long)dest + 0xb) = *(undefined8 *)((long)src + 0xb);
    *(undefined8 *)((long)dest + 0x13) = uVar1;
    goto LAB_016002ed;
  case 0x1c:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x14);
    *(undefined8 *)((long)dest + 0xc) = *(undefined8 *)((long)src + 0xc);
    *(undefined8 *)((long)dest + 0x14) = uVar1;
    goto LAB_016002ed;
  case 0x1d:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x15);
    *(undefined8 *)((long)dest + 0xd) = *(undefined8 *)((long)src + 0xd);
    *(undefined8 *)((long)dest + 0x15) = uVar1;
    goto LAB_016002ed;
  case 0x1e:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x16);
    *(undefined8 *)((long)dest + 0xe) = *(undefined8 *)((long)src + 0xe);
    *(undefined8 *)((long)dest + 0x16) = uVar1;
    goto LAB_016002ed;
  case 0x1f:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar1 = *(undefined8 *)((long)src + 0x17);
    *(undefined8 *)((long)dest + 0xf) = *(undefined8 *)((long)src + 0xf);
    *(undefined8 *)((long)dest + 0x17) = uVar1;
    goto LAB_016002ed;
  case 0x20:
    goto switchD_015ff80e_caseD_20;
  case 0x21:
    *(undefined1 *)((long)dest + 0x20) = *(undefined1 *)((long)src + 0x20);
    goto switchD_015ff80e_caseD_20;
  case 0x22:
    *(undefined2 *)((long)dest + 0x20) = *(undefined2 *)((long)src + 0x20);
    goto switchD_015ff80e_caseD_20;
  case 0x23:
    *(undefined4 *)((long)dest + 0x1f) = *(undefined4 *)((long)src + 0x1f);
    goto switchD_015ff80e_caseD_20;
  case 0x24:
    *(undefined4 *)((long)dest + 0x20) = *(undefined4 *)((long)src + 0x20);
    goto switchD_015ff80e_caseD_20;
  case 0x25:
    *(undefined8 *)((long)dest + 0x1d) = *(undefined8 *)((long)src + 0x1d);
    goto switchD_015ff80e_caseD_20;
  case 0x26:
    *(undefined8 *)((long)dest + 0x1e) = *(undefined8 *)((long)src + 0x1e);
    goto switchD_015ff80e_caseD_20;
  case 0x27:
    *(undefined8 *)((long)dest + 0x1f) = *(undefined8 *)((long)src + 0x1f);
    goto switchD_015ff80e_caseD_20;
  case 0x28:
    *(undefined8 *)((long)dest + 0x20) = *(undefined8 *)((long)src + 0x20);
switchD_015ff80e_caseD_20:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
LAB_016002c4:
    *(undefined4 *)((long)dest + 0x10) = uVar6;
    *(undefined4 *)((long)dest + 0x14) = uVar7;
    *(undefined4 *)((long)dest + 0x18) = uVar8;
    *(undefined4 *)((long)dest + 0x1c) = uVar9;
    goto LAB_016002ed;
  case 0x29:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x21);
    *(undefined8 *)((long)dest + 0x19) = *(undefined8 *)((long)src + 0x19);
    *(undefined8 *)((long)dest + 0x21) = uVar1;
    goto LAB_016002c4;
  case 0x2a:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x22);
    *(undefined8 *)((long)dest + 0x1a) = *(undefined8 *)((long)src + 0x1a);
    *(undefined8 *)((long)dest + 0x22) = uVar1;
    goto LAB_016002c4;
  case 0x2b:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x23);
    *(undefined8 *)((long)dest + 0x1b) = *(undefined8 *)((long)src + 0x1b);
    *(undefined8 *)((long)dest + 0x23) = uVar1;
    goto LAB_016002c4;
  case 0x2c:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x24);
    *(undefined8 *)((long)dest + 0x1c) = *(undefined8 *)((long)src + 0x1c);
    *(undefined8 *)((long)dest + 0x24) = uVar1;
    goto LAB_016002c4;
  case 0x2d:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x25);
    *(undefined8 *)((long)dest + 0x1d) = *(undefined8 *)((long)src + 0x1d);
    *(undefined8 *)((long)dest + 0x25) = uVar1;
    goto LAB_016002c4;
  case 0x2e:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x26);
    *(undefined8 *)((long)dest + 0x1e) = *(undefined8 *)((long)src + 0x1e);
    *(undefined8 *)((long)dest + 0x26) = uVar1;
    goto LAB_016002c4;
  case 0x2f:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar1 = *(undefined8 *)((long)src + 0x27);
    *(undefined8 *)((long)dest + 0x1f) = *(undefined8 *)((long)src + 0x1f);
    *(undefined8 *)((long)dest + 0x27) = uVar1;
    goto LAB_016002c4;
  case 0x30:
    goto switchD_015ff80e_caseD_30;
  case 0x31:
    *(undefined1 *)((long)dest + 0x30) = *(undefined1 *)((long)src + 0x30);
    goto switchD_015ff80e_caseD_30;
  case 0x32:
    *(undefined2 *)((long)dest + 0x30) = *(undefined2 *)((long)src + 0x30);
    goto switchD_015ff80e_caseD_30;
  case 0x33:
    *(undefined4 *)((long)dest + 0x2f) = *(undefined4 *)((long)src + 0x2f);
    goto switchD_015ff80e_caseD_30;
  case 0x34:
    *(undefined4 *)((long)dest + 0x30) = *(undefined4 *)((long)src + 0x30);
    goto switchD_015ff80e_caseD_30;
  case 0x35:
    *(undefined8 *)((long)dest + 0x2d) = *(undefined8 *)((long)src + 0x2d);
    goto switchD_015ff80e_caseD_30;
  case 0x36:
    *(undefined8 *)((long)dest + 0x2e) = *(undefined8 *)((long)src + 0x2e);
    goto switchD_015ff80e_caseD_30;
  case 0x37:
    *(undefined8 *)((long)dest + 0x2f) = *(undefined8 *)((long)src + 0x2f);
    goto switchD_015ff80e_caseD_30;
  case 0x38:
    *(undefined8 *)((long)dest + 0x30) = *(undefined8 *)((long)src + 0x30);
switchD_015ff80e_caseD_30:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
LAB_01600195:
    *(undefined4 *)((long)dest + 0x20) = uVar10;
    *(undefined4 *)((long)dest + 0x24) = uVar11;
    *(undefined4 *)((long)dest + 0x28) = uVar12;
    *(undefined4 *)((long)dest + 0x2c) = uVar13;
    goto LAB_016002c4;
  case 0x39:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x31);
    *(undefined8 *)((long)dest + 0x29) = *(undefined8 *)((long)src + 0x29);
    *(undefined8 *)((long)dest + 0x31) = uVar1;
    goto LAB_01600195;
  case 0x3a:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x32);
    *(undefined8 *)((long)dest + 0x2a) = *(undefined8 *)((long)src + 0x2a);
    *(undefined8 *)((long)dest + 0x32) = uVar1;
    goto LAB_01600195;
  case 0x3b:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x33);
    *(undefined8 *)((long)dest + 0x2b) = *(undefined8 *)((long)src + 0x2b);
    *(undefined8 *)((long)dest + 0x33) = uVar1;
    goto LAB_01600195;
  case 0x3c:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x34);
    *(undefined8 *)((long)dest + 0x2c) = *(undefined8 *)((long)src + 0x2c);
    *(undefined8 *)((long)dest + 0x34) = uVar1;
    goto LAB_01600195;
  case 0x3d:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x35);
    *(undefined8 *)((long)dest + 0x2d) = *(undefined8 *)((long)src + 0x2d);
    *(undefined8 *)((long)dest + 0x35) = uVar1;
    goto LAB_01600195;
  case 0x3e:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x36);
    *(undefined8 *)((long)dest + 0x2e) = *(undefined8 *)((long)src + 0x2e);
    *(undefined8 *)((long)dest + 0x36) = uVar1;
    goto LAB_01600195;
  case 0x3f:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x37);
    *(undefined8 *)((long)dest + 0x2f) = *(undefined8 *)((long)src + 0x2f);
    *(undefined8 *)((long)dest + 0x37) = uVar1;
    goto LAB_01600195;
  case 0x40:
    uVar2 = *src;
    uVar3 = *(undefined4 *)((long)src + 4);
    uVar4 = *(undefined4 *)((long)src + 8);
    uVar5 = *(undefined4 *)((long)src + 0xc);
    uVar6 = *(undefined4 *)((long)src + 0x10);
    uVar7 = *(undefined4 *)((long)src + 0x14);
    uVar8 = *(undefined4 *)((long)src + 0x18);
    uVar9 = *(undefined4 *)((long)src + 0x1c);
    uVar10 = *(undefined4 *)((long)src + 0x20);
    uVar11 = *(undefined4 *)((long)src + 0x24);
    uVar12 = *(undefined4 *)((long)src + 0x28);
    uVar13 = *(undefined4 *)((long)src + 0x2c);
    uVar1 = *(undefined8 *)((long)src + 0x38);
    *(undefined8 *)((long)dest + 0x30) = *(undefined8 *)((long)src + 0x30);
    *(undefined8 *)((long)dest + 0x38) = uVar1;
    goto LAB_01600195;
  case 0x41:
    switchD_015ff80e::default(dest,src,0x41);
    return;
  case 0x42:
    switchD_015ff80e::default(dest,src,0x42);
    return;
  case 0x43:
    switchD_015ff80e::default(dest,src,0x43);
    return;
  case 0x44:
    switchD_015ff80e::default(dest,src,0x44);
    return;
  case 0x45:
    switchD_015ff80e::default(dest,src,0x45);
    return;
  case 0x46:
    switchD_015ff80e::default(dest,src,0x46);
    return;
  case 0x47:
    switchD_015ff80e::default(dest,src,0x47);
    return;
  case 0x48:
    switchD_015ff80e::default(dest,src,0x48);
    return;
  case 0x49:
    switchD_015ff80e::default(dest,src,0x49);
    return;
  case 0x4a:
    switchD_015ff80e::default(dest,src,0x4a);
    return;
  case 0x4b:
    switchD_015ff80e::default(dest,src,0x4b);
    return;
  case 0x4c:
    switchD_015ff80e::default(dest,src,0x4c);
    return;
  case 0x4d:
    switchD_015ff80e::default(dest,src,0x4d);
    return;
  case 0x4e:
    switchD_015ff80e::default(dest,src,0x4e);
    return;
  case 0x4f:
    switchD_015ff80e::default(dest,src,0x4f);
    return;
  case 0x50:
    switchD_015ff80e::default(dest,src,0x50);
    return;
  case 0x51:
    switchD_015ff80e::default(dest,src,0x51);
    return;
  case 0x52:
    switchD_015ff80e::default(dest,src,0x52);
    return;
  case 0x53:
    switchD_015ff80e::default(dest,src,0x53);
    return;
  case 0x54:
    switchD_015ff80e::default(dest,src,0x54);
    return;
  case 0x55:
    switchD_015ff80e::default(dest,src,0x55);
    return;
  case 0x56:
    switchD_015ff80e::default(dest,src,0x56);
    return;
  case 0x57:
    switchD_015ff80e::default(dest,src,0x57);
    return;
  case 0x58:
    switchD_015ff80e::default(dest,src,0x58);
    return;
  case 0x59:
    switchD_015ff80e::default(dest,src,0x59);
    return;
  case 0x5a:
    switchD_015ff80e::default(dest,src,0x5a);
    return;
  case 0x5b:
    switchD_015ff80e::default(dest,src,0x5b);
    return;
  case 0x5c:
    switchD_015ff80e::default(dest,src,0x5c);
    return;
  case 0x5d:
    switchD_015ff80e::default(dest,src,0x5d);
    return;
  case 0x5e:
    switchD_015ff80e::default(dest,src,0x5e);
    return;
  case 0x5f:
    switchD_015ff80e::default(dest,src,0x5f);
    return;
  case 0x60:
    switchD_015ff80e::default(dest,src,0x60);
    return;
  case 0x61:
    switchD_015ff80e::default(dest,src,0x61);
    return;
  case 0x62:
    switchD_015ff80e::default(dest,src,0x62);
    return;
  case 99:
    switchD_015ff80e::default(dest,src,99);
    return;
  case 100:
    switchD_015ff80e::default(dest,src,100);
    return;
  case 0x65:
    switchD_015ff80e::default(dest,src,0x65);
    return;
  case 0x66:
    switchD_015ff80e::default(dest,src,0x66);
    return;
  case 0x67:
    switchD_015ff80e::default(dest,src,0x67);
    return;
  case 0x68:
    switchD_015ff80e::default(dest,src,0x68);
    return;
  case 0x69:
    switchD_015ff80e::default(dest,src,0x69);
    return;
  case 0x6a:
    switchD_015ff80e::default(dest,src,0x6a);
    return;
  case 0x6b:
    switchD_015ff80e::default(dest,src,0x6b);
    return;
  case 0x6c:
    switchD_015ff80e::default(dest,src,0x6c);
    return;
  case 0x6d:
    switchD_015ff80e::default(dest,src,0x6d);
    return;
  case 0x6e:
    switchD_015ff80e::default(dest,src,0x6e);
    return;
  case 0x6f:
    switchD_015ff80e::default(dest,src,0x6f);
    return;
  case 0x70:
    switchD_015ff80e::default(dest,src,0x70);
    return;
  case 0x71:
    switchD_015ff80e::default(dest,src,0x71);
    return;
  case 0x72:
    switchD_015ff80e::default(dest,src,0x72);
    return;
  case 0x73:
    switchD_015ff80e::default(dest,src,0x73);
    return;
  case 0x74:
    switchD_015ff80e::default(dest,src,0x74);
    return;
  case 0x75:
    switchD_015ff80e::default(dest,src,0x75);
    return;
  case 0x76:
    switchD_015ff80e::default(dest,src,0x76);
    return;
  case 0x77:
    switchD_015ff80e::default(dest,src,0x77);
    return;
  case 0x78:
    switchD_015ff80e::default(dest,src,0x78);
    return;
  case 0x79:
    switchD_015ff80e::default(dest,src,0x79);
    return;
  case 0x7a:
    switchD_015ff80e::default(dest,src,0x7a);
    return;
  case 0x7b:
    switchD_015ff80e::default(dest,src,0x7b);
    return;
  case 0x7c:
    switchD_015ff80e::default(dest,src,0x7c);
    return;
  case 0x7d:
    switchD_015ff80e::default(dest,src,0x7d);
    return;
  case 0x7e:
    switchD_015ff80e::default(dest,src,0x7e);
    return;
  case 0x7f:
    switchD_015ff80e::default(dest,src,0x7f);
    return;
  case 0x80:
    switchD_015ff80e::default(dest,src,0x80);
    return;
  case 0x81:
    switchD_015ff80e::default(dest,src,0x81);
    return;
  case 0x82:
    switchD_015ff80e::default(dest,src,0x82);
    return;
  case 0x83:
    switchD_015ff80e::default(dest,src,0x83);
    return;
  case 0x84:
    switchD_015ff80e::default(dest,src,0x84);
    return;
  case 0x85:
    switchD_015ff80e::default(dest,src,0x85);
    return;
  case 0x86:
    switchD_015ff80e::default(dest,src,0x86);
    return;
  case 0x87:
    switchD_015ff80e::default(dest,src,0x87);
    return;
  case 0x88:
    switchD_015ff80e::default(dest,src,0x88);
    return;
  case 0x89:
    switchD_015ff80e::default(dest,src,0x89);
    return;
  case 0x8a:
    switchD_015ff80e::default(dest,src,0x8a);
    return;
  case 0x8b:
    switchD_015ff80e::default(dest,src,0x8b);
    return;
  case 0x8c:
    switchD_015ff80e::default(dest,src,0x8c);
    return;
  case 0x8d:
    switchD_015ff80e::default(dest,src,0x8d);
    return;
  case 0x8e:
    switchD_015ff80e::default(dest,src,0x8e);
    return;
  case 0x8f:
    switchD_015ff80e::default(dest,src,0x8f);
    return;
  case 0x90:
    switchD_015ff80e::default(dest,src,0x90);
    return;
  case 0x91:
    switchD_015ff80e::default(dest,src,0x91);
    return;
  case 0x92:
    switchD_015ff80e::default(dest,src,0x92);
    return;
  case 0x93:
    switchD_015ff80e::default(dest,src,0x93);
    return;
  case 0x94:
    switchD_015ff80e::default(dest,src,0x94);
    return;
  case 0x95:
    switchD_015ff80e::default(dest,src,0x95);
    return;
  case 0x96:
    switchD_015ff80e::default(dest,src,0x96);
    return;
  case 0x97:
    switchD_015ff80e::default(dest,src,0x97);
    return;
  case 0x98:
    switchD_015ff80e::default(dest,src,0x98);
    return;
  case 0x99:
    switchD_015ff80e::default(dest,src,0x99);
    return;
  case 0x9a:
    switchD_015ff80e::default(dest,src,0x9a);
    return;
  case 0x9b:
    switchD_015ff80e::default(dest,src,0x9b);
    return;
  case 0x9c:
    switchD_015ff80e::default(dest,src,0x9c);
    return;
  case 0x9d:
    switchD_015ff80e::default(dest,src,0x9d);
    return;
  case 0x9e:
    switchD_015ff80e::default(dest,src,0x9e);
    return;
  case 0x9f:
    switchD_015ff80e::default(dest,src,0x9f);
    return;
  case 0xa0:
    switchD_015ff80e::default(dest,src,0xa0);
    return;
  case 0xa1:
    switchD_015ff80e::default(dest,src,0xa1);
    return;
  case 0xa2:
    switchD_015ff80e::default(dest,src,0xa2);
    return;
  case 0xa3:
    switchD_015ff80e::default(dest,src,0xa3);
    return;
  case 0xa4:
    switchD_015ff80e::default(dest,src,0xa4);
    return;
  case 0xa5:
    switchD_015ff80e::default(dest,src,0xa5);
    return;
  case 0xa6:
    switchD_015ff80e::default(dest,src,0xa6);
    return;
  case 0xa7:
    switchD_015ff80e::default(dest,src,0xa7);
    return;
  case 0xa8:
    switchD_015ff80e::default(dest,src,0xa8);
    return;
  case 0xa9:
    switchD_015ff80e::default(dest,src,0xa9);
    return;
  case 0xaa:
    switchD_015ff80e::default(dest,src,0xaa);
    return;
  case 0xab:
    switchD_015ff80e::default(dest,src,0xab);
    return;
  case 0xac:
    switchD_015ff80e::default(dest,src,0xac);
    return;
  case 0xad:
    switchD_015ff80e::default(dest,src,0xad);
    return;
  case 0xae:
    switchD_015ff80e::default(dest,src,0xae);
    return;
  case 0xaf:
    switchD_015ff80e::default(dest,src,0xaf);
    return;
  case 0xb0:
    switchD_015ff80e::default(dest,src,0xb0);
    return;
  case 0xb1:
    switchD_015ff80e::default(dest,src,0xb1);
    return;
  case 0xb2:
    switchD_015ff80e::default(dest,src,0xb2);
    return;
  case 0xb3:
    switchD_015ff80e::default(dest,src,0xb3);
    return;
  case 0xb4:
    switchD_015ff80e::default(dest,src,0xb4);
    return;
  case 0xb5:
    switchD_015ff80e::default(dest,src,0xb5);
    return;
  case 0xb6:
    switchD_015ff80e::default(dest,src,0xb6);
    return;
  case 0xb7:
    switchD_015ff80e::default(dest,src,0xb7);
    return;
  case 0xb8:
    switchD_015ff80e::default(dest,src,0xb8);
    return;
  case 0xb9:
    switchD_015ff80e::default(dest,src,0xb9);
    return;
  case 0xba:
    switchD_015ff80e::default(dest,src,0xba);
    return;
  case 0xbb:
    switchD_015ff80e::default(dest,src,0xbb);
    return;
  case 0xbc:
    switchD_015ff80e::default(dest,src,0xbc);
    return;
  case 0xbd:
    switchD_015ff80e::default(dest,src,0xbd);
    return;
  case 0xbe:
    switchD_015ff80e::default(dest,src,0xbe);
    return;
  case 0xbf:
    switchD_015ff80e::default(dest,src,0xbf);
    return;
  case 0xc0:
    switchD_015ff80e::default(dest,src,0xc0);
    return;
  case 0xc1:
    switchD_015ff80e::default(dest,src,0xc1);
    return;
  case 0xc2:
    switchD_015ff80e::default(dest,src,0xc2);
    return;
  case 0xc3:
    switchD_015ff80e::default(dest,src,0xc3);
    return;
  case 0xc4:
    switchD_015ff80e::default(dest,src,0xc4);
    return;
  case 0xc5:
    switchD_015ff80e::default(dest,src,0xc5);
    return;
  case 0xc6:
    switchD_015ff80e::default(dest,src,0xc6);
    return;
  case 199:
    switchD_015ff80e::default(dest,src,199);
    return;
  case 200:
    switchD_015ff80e::default(dest,src,200);
    return;
  case 0xc9:
    switchD_015ff80e::default(dest,src,0xc9);
    return;
  case 0xca:
    switchD_015ff80e::default(dest,src,0xca);
    return;
  case 0xcb:
    switchD_015ff80e::default(dest,src,0xcb);
    return;
  case 0xcc:
    switchD_015ff80e::default(dest,src,0xcc);
    return;
  case 0xcd:
    switchD_015ff80e::default(dest,src,0xcd);
    return;
  case 0xce:
    switchD_015ff80e::default(dest,src,0xce);
    return;
  case 0xcf:
    switchD_015ff80e::default(dest,src,0xcf);
    return;
  case 0xd0:
    switchD_015ff80e::default(dest,src,0xd0);
    return;
  case 0xd1:
    switchD_015ff80e::default(dest,src,0xd1);
    return;
  case 0xd2:
    switchD_015ff80e::default(dest,src,0xd2);
    return;
  case 0xd3:
    switchD_015ff80e::default(dest,src,0xd3);
    return;
  case 0xd4:
    switchD_015ff80e::default(dest,src,0xd4);
    return;
  case 0xd5:
    switchD_015ff80e::default(dest,src,0xd5);
    return;
  case 0xd6:
    switchD_015ff80e::default(dest,src,0xd6);
    return;
  case 0xd7:
    switchD_015ff80e::default(dest,src,0xd7);
    return;
  case 0xd8:
    switchD_015ff80e::default(dest,src,0xd8);
    return;
  case 0xd9:
    switchD_015ff80e::default(dest,src,0xd9);
    return;
  case 0xda:
    switchD_015ff80e::default(dest,src,0xda);
    return;
  case 0xdb:
    switchD_015ff80e::default(dest,src,0xdb);
    return;
  case 0xdc:
    switchD_015ff80e::default(dest,src,0xdc);
    return;
  case 0xdd:
    switchD_015ff80e::default(dest,src,0xdd);
    return;
  case 0xde:
    switchD_015ff80e::default(dest,src,0xde);
    return;
  case 0xdf:
    switchD_015ff80e::default(dest,src,0xdf);
    return;
  case 0xe0:
    switchD_015ff80e::default(dest,src,0xe0);
    return;
  case 0xe1:
    switchD_015ff80e::default(dest,src,0xe1);
    return;
  case 0xe2:
    switchD_015ff80e::default(dest,src,0xe2);
    return;
  case 0xe3:
    switchD_015ff80e::default(dest,src,0xe3);
    return;
  case 0xe4:
    switchD_015ff80e::default(dest,src,0xe4);
    return;
  case 0xe5:
    switchD_015ff80e::default(dest,src,0xe5);
    return;
  case 0xe6:
    switchD_015ff80e::default(dest,src,0xe6);
    return;
  case 0xe7:
    switchD_015ff80e::default(dest,src,0xe7);
    return;
  case 0xe8:
    switchD_015ff80e::default(dest,src,0xe8);
    return;
  case 0xe9:
    switchD_015ff80e::default(dest,src,0xe9);
    return;
  case 0xea:
    switchD_015ff80e::default(dest,src,0xea);
    return;
  case 0xeb:
    switchD_015ff80e::default(dest,src,0xeb);
    return;
  case 0xec:
    switchD_015ff80e::default(dest,src,0xec);
    return;
  case 0xed:
    switchD_015ff80e::default(dest,src,0xed);
    return;
  case 0xee:
    switchD_015ff80e::default(dest,src,0xee);
    return;
  case 0xef:
    switchD_015ff80e::default(dest,src,0xef);
    return;
  case 0xf0:
    switchD_015ff80e::default(dest,src,0xf0);
    return;
  case 0xf1:
    switchD_015ff80e::default(dest,src,0xf1);
    return;
  case 0xf2:
    switchD_015ff80e::default(dest,src,0xf2);
    return;
  case 0xf3:
    switchD_015ff80e::default(dest,src,0xf3);
    return;
  case 0xf4:
    switchD_015ff80e::default(dest,src,0xf4);
    return;
  case 0xf5:
    switchD_015ff80e::default(dest,src,0xf5);
    return;
  case 0xf6:
    switchD_015ff80e::default(dest,src,0xf6);
    return;
  case 0xf7:
    switchD_015ff80e::default(dest,src,0xf7);
    return;
  case 0xf8:
    switchD_015ff80e::default(dest,src,0xf8);
    return;
  case 0xf9:
    switchD_015ff80e::default(dest,src,0xf9);
    return;
  case 0xfa:
    switchD_015ff80e::default(dest,src,0xfa);
    return;
  case 0xfb:
    switchD_015ff80e::default(dest,src,0xfb);
    return;
  case 0xfc:
    switchD_015ff80e::default(dest,src,0xfc);
    return;
  case 0xfd:
    switchD_015ff80e::default(dest,src,0xfd);
    return;
  case 0xfe:
    switchD_015ff80e::default(dest,src,0xfe);
    return;
  case 0xff:
    switchD_015ff80e::default(dest,src,0xff);
    return;
  case 0x100:
    switchD_015ff80e::default(dest,src,0x100);
    return;
  default:
    memcpy(dest,src,size);
    return;
  }
  uVar2 = *src;
  uVar3 = *(undefined4 *)((long)src + 4);
  uVar4 = *(undefined4 *)((long)src + 8);
  uVar5 = *(undefined4 *)((long)src + 0xc);
LAB_016002ed:
  *(undefined4 *)dest = uVar2;
  *(undefined4 *)((long)dest + 4) = uVar3;
  *(undefined4 *)((long)dest + 8) = uVar4;
  *(undefined4 *)((long)dest + 0xc) = uVar5;
  return;
}

Assistant:

inline void FastMemcpy(void *dest, const void *src, const size_t size) {
	// LCOV_EXCL_START
	switch (size) {
	case 0:
		return;
	case 1:
		return MemcpyFixed<1>(dest, src);
	case 2:
		return MemcpyFixed<2>(dest, src);
	case 3:
		return MemcpyFixed<3>(dest, src);
	case 4:
		return MemcpyFixed<4>(dest, src);
	case 5:
		return MemcpyFixed<5>(dest, src);
	case 6:
		return MemcpyFixed<6>(dest, src);
	case 7:
		return MemcpyFixed<7>(dest, src);
	case 8:
		return MemcpyFixed<8>(dest, src);
	case 9:
		return MemcpyFixed<9>(dest, src);
	case 10:
		return MemcpyFixed<10>(dest, src);
	case 11:
		return MemcpyFixed<11>(dest, src);
	case 12:
		return MemcpyFixed<12>(dest, src);
	case 13:
		return MemcpyFixed<13>(dest, src);
	case 14:
		return MemcpyFixed<14>(dest, src);
	case 15:
		return MemcpyFixed<15>(dest, src);
	case 16:
		return MemcpyFixed<16>(dest, src);
	case 17:
		return MemcpyFixed<17>(dest, src);
	case 18:
		return MemcpyFixed<18>(dest, src);
	case 19:
		return MemcpyFixed<19>(dest, src);
	case 20:
		return MemcpyFixed<20>(dest, src);
	case 21:
		return MemcpyFixed<21>(dest, src);
	case 22:
		return MemcpyFixed<22>(dest, src);
	case 23:
		return MemcpyFixed<23>(dest, src);
	case 24:
		return MemcpyFixed<24>(dest, src);
	case 25:
		return MemcpyFixed<25>(dest, src);
	case 26:
		return MemcpyFixed<26>(dest, src);
	case 27:
		return MemcpyFixed<27>(dest, src);
	case 28:
		return MemcpyFixed<28>(dest, src);
	case 29:
		return MemcpyFixed<29>(dest, src);
	case 30:
		return MemcpyFixed<30>(dest, src);
	case 31:
		return MemcpyFixed<31>(dest, src);
	case 32:
		return MemcpyFixed<32>(dest, src);
	case 33:
		return MemcpyFixed<33>(dest, src);
	case 34:
		return MemcpyFixed<34>(dest, src);
	case 35:
		return MemcpyFixed<35>(dest, src);
	case 36:
		return MemcpyFixed<36>(dest, src);
	case 37:
		return MemcpyFixed<37>(dest, src);
	case 38:
		return MemcpyFixed<38>(dest, src);
	case 39:
		return MemcpyFixed<39>(dest, src);
	case 40:
		return MemcpyFixed<40>(dest, src);
	case 41:
		return MemcpyFixed<41>(dest, src);
	case 42:
		return MemcpyFixed<42>(dest, src);
	case 43:
		return MemcpyFixed<43>(dest, src);
	case 44:
		return MemcpyFixed<44>(dest, src);
	case 45:
		return MemcpyFixed<45>(dest, src);
	case 46:
		return MemcpyFixed<46>(dest, src);
	case 47:
		return MemcpyFixed<47>(dest, src);
	case 48:
		return MemcpyFixed<48>(dest, src);
	case 49:
		return MemcpyFixed<49>(dest, src);
	case 50:
		return MemcpyFixed<50>(dest, src);
	case 51:
		return MemcpyFixed<51>(dest, src);
	case 52:
		return MemcpyFixed<52>(dest, src);
	case 53:
		return MemcpyFixed<53>(dest, src);
	case 54:
		return MemcpyFixed<54>(dest, src);
	case 55:
		return MemcpyFixed<55>(dest, src);
	case 56:
		return MemcpyFixed<56>(dest, src);
	case 57:
		return MemcpyFixed<57>(dest, src);
	case 58:
		return MemcpyFixed<58>(dest, src);
	case 59:
		return MemcpyFixed<59>(dest, src);
	case 60:
		return MemcpyFixed<60>(dest, src);
	case 61:
		return MemcpyFixed<61>(dest, src);
	case 62:
		return MemcpyFixed<62>(dest, src);
	case 63:
		return MemcpyFixed<63>(dest, src);
	case 64:
		return MemcpyFixed<64>(dest, src);
	case 65:
		return MemcpyFixed<65>(dest, src);
	case 66:
		return MemcpyFixed<66>(dest, src);
	case 67:
		return MemcpyFixed<67>(dest, src);
	case 68:
		return MemcpyFixed<68>(dest, src);
	case 69:
		return MemcpyFixed<69>(dest, src);
	case 70:
		return MemcpyFixed<70>(dest, src);
	case 71:
		return MemcpyFixed<71>(dest, src);
	case 72:
		return MemcpyFixed<72>(dest, src);
	case 73:
		return MemcpyFixed<73>(dest, src);
	case 74:
		return MemcpyFixed<74>(dest, src);
	case 75:
		return MemcpyFixed<75>(dest, src);
	case 76:
		return MemcpyFixed<76>(dest, src);
	case 77:
		return MemcpyFixed<77>(dest, src);
	case 78:
		return MemcpyFixed<78>(dest, src);
	case 79:
		return MemcpyFixed<79>(dest, src);
	case 80:
		return MemcpyFixed<80>(dest, src);
	case 81:
		return MemcpyFixed<81>(dest, src);
	case 82:
		return MemcpyFixed<82>(dest, src);
	case 83:
		return MemcpyFixed<83>(dest, src);
	case 84:
		return MemcpyFixed<84>(dest, src);
	case 85:
		return MemcpyFixed<85>(dest, src);
	case 86:
		return MemcpyFixed<86>(dest, src);
	case 87:
		return MemcpyFixed<87>(dest, src);
	case 88:
		return MemcpyFixed<88>(dest, src);
	case 89:
		return MemcpyFixed<89>(dest, src);
	case 90:
		return MemcpyFixed<90>(dest, src);
	case 91:
		return MemcpyFixed<91>(dest, src);
	case 92:
		return MemcpyFixed<92>(dest, src);
	case 93:
		return MemcpyFixed<93>(dest, src);
	case 94:
		return MemcpyFixed<94>(dest, src);
	case 95:
		return MemcpyFixed<95>(dest, src);
	case 96:
		return MemcpyFixed<96>(dest, src);
	case 97:
		return MemcpyFixed<97>(dest, src);
	case 98:
		return MemcpyFixed<98>(dest, src);
	case 99:
		return MemcpyFixed<99>(dest, src);
	case 100:
		return MemcpyFixed<100>(dest, src);
	case 101:
		return MemcpyFixed<101>(dest, src);
	case 102:
		return MemcpyFixed<102>(dest, src);
	case 103:
		return MemcpyFixed<103>(dest, src);
	case 104:
		return MemcpyFixed<104>(dest, src);
	case 105:
		return MemcpyFixed<105>(dest, src);
	case 106:
		return MemcpyFixed<106>(dest, src);
	case 107:
		return MemcpyFixed<107>(dest, src);
	case 108:
		return MemcpyFixed<108>(dest, src);
	case 109:
		return MemcpyFixed<109>(dest, src);
	case 110:
		return MemcpyFixed<110>(dest, src);
	case 111:
		return MemcpyFixed<111>(dest, src);
	case 112:
		return MemcpyFixed<112>(dest, src);
	case 113:
		return MemcpyFixed<113>(dest, src);
	case 114:
		return MemcpyFixed<114>(dest, src);
	case 115:
		return MemcpyFixed<115>(dest, src);
	case 116:
		return MemcpyFixed<116>(dest, src);
	case 117:
		return MemcpyFixed<117>(dest, src);
	case 118:
		return MemcpyFixed<118>(dest, src);
	case 119:
		return MemcpyFixed<119>(dest, src);
	case 120:
		return MemcpyFixed<120>(dest, src);
	case 121:
		return MemcpyFixed<121>(dest, src);
	case 122:
		return MemcpyFixed<122>(dest, src);
	case 123:
		return MemcpyFixed<123>(dest, src);
	case 124:
		return MemcpyFixed<124>(dest, src);
	case 125:
		return MemcpyFixed<125>(dest, src);
	case 126:
		return MemcpyFixed<126>(dest, src);
	case 127:
		return MemcpyFixed<127>(dest, src);
	case 128:
		return MemcpyFixed<128>(dest, src);
	case 129:
		return MemcpyFixed<129>(dest, src);
	case 130:
		return MemcpyFixed<130>(dest, src);
	case 131:
		return MemcpyFixed<131>(dest, src);
	case 132:
		return MemcpyFixed<132>(dest, src);
	case 133:
		return MemcpyFixed<133>(dest, src);
	case 134:
		return MemcpyFixed<134>(dest, src);
	case 135:
		return MemcpyFixed<135>(dest, src);
	case 136:
		return MemcpyFixed<136>(dest, src);
	case 137:
		return MemcpyFixed<137>(dest, src);
	case 138:
		return MemcpyFixed<138>(dest, src);
	case 139:
		return MemcpyFixed<139>(dest, src);
	case 140:
		return MemcpyFixed<140>(dest, src);
	case 141:
		return MemcpyFixed<141>(dest, src);
	case 142:
		return MemcpyFixed<142>(dest, src);
	case 143:
		return MemcpyFixed<143>(dest, src);
	case 144:
		return MemcpyFixed<144>(dest, src);
	case 145:
		return MemcpyFixed<145>(dest, src);
	case 146:
		return MemcpyFixed<146>(dest, src);
	case 147:
		return MemcpyFixed<147>(dest, src);
	case 148:
		return MemcpyFixed<148>(dest, src);
	case 149:
		return MemcpyFixed<149>(dest, src);
	case 150:
		return MemcpyFixed<150>(dest, src);
	case 151:
		return MemcpyFixed<151>(dest, src);
	case 152:
		return MemcpyFixed<152>(dest, src);
	case 153:
		return MemcpyFixed<153>(dest, src);
	case 154:
		return MemcpyFixed<154>(dest, src);
	case 155:
		return MemcpyFixed<155>(dest, src);
	case 156:
		return MemcpyFixed<156>(dest, src);
	case 157:
		return MemcpyFixed<157>(dest, src);
	case 158:
		return MemcpyFixed<158>(dest, src);
	case 159:
		return MemcpyFixed<159>(dest, src);
	case 160:
		return MemcpyFixed<160>(dest, src);
	case 161:
		return MemcpyFixed<161>(dest, src);
	case 162:
		return MemcpyFixed<162>(dest, src);
	case 163:
		return MemcpyFixed<163>(dest, src);
	case 164:
		return MemcpyFixed<164>(dest, src);
	case 165:
		return MemcpyFixed<165>(dest, src);
	case 166:
		return MemcpyFixed<166>(dest, src);
	case 167:
		return MemcpyFixed<167>(dest, src);
	case 168:
		return MemcpyFixed<168>(dest, src);
	case 169:
		return MemcpyFixed<169>(dest, src);
	case 170:
		return MemcpyFixed<170>(dest, src);
	case 171:
		return MemcpyFixed<171>(dest, src);
	case 172:
		return MemcpyFixed<172>(dest, src);
	case 173:
		return MemcpyFixed<173>(dest, src);
	case 174:
		return MemcpyFixed<174>(dest, src);
	case 175:
		return MemcpyFixed<175>(dest, src);
	case 176:
		return MemcpyFixed<176>(dest, src);
	case 177:
		return MemcpyFixed<177>(dest, src);
	case 178:
		return MemcpyFixed<178>(dest, src);
	case 179:
		return MemcpyFixed<179>(dest, src);
	case 180:
		return MemcpyFixed<180>(dest, src);
	case 181:
		return MemcpyFixed<181>(dest, src);
	case 182:
		return MemcpyFixed<182>(dest, src);
	case 183:
		return MemcpyFixed<183>(dest, src);
	case 184:
		return MemcpyFixed<184>(dest, src);
	case 185:
		return MemcpyFixed<185>(dest, src);
	case 186:
		return MemcpyFixed<186>(dest, src);
	case 187:
		return MemcpyFixed<187>(dest, src);
	case 188:
		return MemcpyFixed<188>(dest, src);
	case 189:
		return MemcpyFixed<189>(dest, src);
	case 190:
		return MemcpyFixed<190>(dest, src);
	case 191:
		return MemcpyFixed<191>(dest, src);
	case 192:
		return MemcpyFixed<192>(dest, src);
	case 193:
		return MemcpyFixed<193>(dest, src);
	case 194:
		return MemcpyFixed<194>(dest, src);
	case 195:
		return MemcpyFixed<195>(dest, src);
	case 196:
		return MemcpyFixed<196>(dest, src);
	case 197:
		return MemcpyFixed<197>(dest, src);
	case 198:
		return MemcpyFixed<198>(dest, src);
	case 199:
		return MemcpyFixed<199>(dest, src);
	case 200:
		return MemcpyFixed<200>(dest, src);
	case 201:
		return MemcpyFixed<201>(dest, src);
	case 202:
		return MemcpyFixed<202>(dest, src);
	case 203:
		return MemcpyFixed<203>(dest, src);
	case 204:
		return MemcpyFixed<204>(dest, src);
	case 205:
		return MemcpyFixed<205>(dest, src);
	case 206:
		return MemcpyFixed<206>(dest, src);
	case 207:
		return MemcpyFixed<207>(dest, src);
	case 208:
		return MemcpyFixed<208>(dest, src);
	case 209:
		return MemcpyFixed<209>(dest, src);
	case 210:
		return MemcpyFixed<210>(dest, src);
	case 211:
		return MemcpyFixed<211>(dest, src);
	case 212:
		return MemcpyFixed<212>(dest, src);
	case 213:
		return MemcpyFixed<213>(dest, src);
	case 214:
		return MemcpyFixed<214>(dest, src);
	case 215:
		return MemcpyFixed<215>(dest, src);
	case 216:
		return MemcpyFixed<216>(dest, src);
	case 217:
		return MemcpyFixed<217>(dest, src);
	case 218:
		return MemcpyFixed<218>(dest, src);
	case 219:
		return MemcpyFixed<219>(dest, src);
	case 220:
		return MemcpyFixed<220>(dest, src);
	case 221:
		return MemcpyFixed<221>(dest, src);
	case 222:
		return MemcpyFixed<222>(dest, src);
	case 223:
		return MemcpyFixed<223>(dest, src);
	case 224:
		return MemcpyFixed<224>(dest, src);
	case 225:
		return MemcpyFixed<225>(dest, src);
	case 226:
		return MemcpyFixed<226>(dest, src);
	case 227:
		return MemcpyFixed<227>(dest, src);
	case 228:
		return MemcpyFixed<228>(dest, src);
	case 229:
		return MemcpyFixed<229>(dest, src);
	case 230:
		return MemcpyFixed<230>(dest, src);
	case 231:
		return MemcpyFixed<231>(dest, src);
	case 232:
		return MemcpyFixed<232>(dest, src);
	case 233:
		return MemcpyFixed<233>(dest, src);
	case 234:
		return MemcpyFixed<234>(dest, src);
	case 235:
		return MemcpyFixed<235>(dest, src);
	case 236:
		return MemcpyFixed<236>(dest, src);
	case 237:
		return MemcpyFixed<237>(dest, src);
	case 238:
		return MemcpyFixed<238>(dest, src);
	case 239:
		return MemcpyFixed<239>(dest, src);
	case 240:
		return MemcpyFixed<240>(dest, src);
	case 241:
		return MemcpyFixed<241>(dest, src);
	case 242:
		return MemcpyFixed<242>(dest, src);
	case 243:
		return MemcpyFixed<243>(dest, src);
	case 244:
		return MemcpyFixed<244>(dest, src);
	case 245:
		return MemcpyFixed<245>(dest, src);
	case 246:
		return MemcpyFixed<246>(dest, src);
	case 247:
		return MemcpyFixed<247>(dest, src);
	case 248:
		return MemcpyFixed<248>(dest, src);
	case 249:
		return MemcpyFixed<249>(dest, src);
	case 250:
		return MemcpyFixed<250>(dest, src);
	case 251:
		return MemcpyFixed<251>(dest, src);
	case 252:
		return MemcpyFixed<252>(dest, src);
	case 253:
		return MemcpyFixed<253>(dest, src);
	case 254:
		return MemcpyFixed<254>(dest, src);
	case 255:
		return MemcpyFixed<255>(dest, src);
	case 256:
		return MemcpyFixed<256>(dest, src);
	default:
		memcpy(dest, src, size);
	}
	// LCOV_EXCL_STOP
}